

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

void __thiscall
TTD::SlabAllocatorBase<0>::ComputeMemoryUsed
          (SlabAllocatorBase<0> *this,uint64 *usedSpace,uint64 *reservedSpace)

{
  LargeSlabBlock *pLVar1;
  uint64 uVar2;
  SlabBlock **ppSVar3;
  LargeSlabBlock **ppLVar4;
  
  uVar2 = 0;
  for (ppSVar3 = &this->m_headBlock; *ppSVar3 != (SlabBlock *)0x0; ppSVar3 = &(*ppSVar3)->Previous)
  {
    uVar2 = uVar2 + this->m_slabBlockSize;
  }
  ppLVar4 = &this->m_largeBlockList;
  while (pLVar1 = *ppLVar4, pLVar1 != (LargeSlabBlock *)0x0) {
    uVar2 = uVar2 + pLVar1->TotalBlockSize;
    ppLVar4 = &pLVar1->Previous;
  }
  *usedSpace = this->m_totalAllocatedSize;
  *reservedSpace = uVar2;
  return;
}

Assistant:

void ComputeMemoryUsed(uint64* usedSpace, uint64* reservedSpace) const
        {
            uint64 memreserved = 0;

            for (SlabBlock* currBlock = this->m_headBlock; currBlock != nullptr; currBlock = currBlock->Previous)
            {
                memreserved += (uint64)this->m_slabBlockSize;
            }

            for (LargeSlabBlock* currLargeBlock = this->m_largeBlockList; currLargeBlock != nullptr; currLargeBlock = currLargeBlock->Previous)
            {
                memreserved += (uint64)(currLargeBlock->TotalBlockSize);
            }

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            *usedSpace = this->m_totalAllocatedSize;
#else
            *usedSpace = 0;
#endif

            *reservedSpace = memreserved;
        }